

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteTagTypes(CWriter *this)

{
  Tag *pTVar1;
  bool bVar2;
  char cVar3;
  vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *this_00;
  reference ppTVar4;
  FuncDeclaration *this_01;
  TypeVector *types;
  Newline local_84;
  Newline local_83;
  CloseBrace local_82 [2];
  Type local_80;
  Type local_78;
  Type local_70;
  Type type;
  Index i;
  string name;
  Index num_params;
  FuncDeclaration *tag_type;
  Tag *tag;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_> *__range2;
  CWriter *this_local;
  
  this_00 = &this->module_->tags;
  __end2 = std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::begin(this_00);
  tag = (Tag *)std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<wabt::Tag_*const_*,_std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>_>
                                     *)&tag), bVar2) {
    ppTVar4 = __gnu_cxx::
              __normal_iterator<wabt::Tag_*const_*,_std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>_>
              ::operator*(&__end2);
    pTVar1 = *ppTVar4;
    this_01 = &pTVar1->decl;
    name.field_2._12_4_ = FuncDeclaration::GetNumParams(this_01);
    if (1 < (uint)name.field_2._12_4_) {
      (anonymous_namespace)::CWriter::MangleTagTypes_abi_cxx11_
                ((string *)&i,(CWriter *)&(pTVar1->decl).sig,types);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[9],std::__cxx11::string_const&,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [9])"#ifndef ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 (Newline *)((long)&type.type_index_ + 3));
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[9],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [9])"#define ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 (char (*) [2])0x21a9d7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 (Newline *)((long)&type.type_index_ + 2));
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[2],wabt::(anonymous_namespace)::OpenBrace>
                ((CWriter *)this,(char (*) [8])0x21dced,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 (char (*) [2])0x21a9d7,(OpenBrace *)((long)&type.type_index_ + 1));
      for (type.enum_ = Any; (uint)type.enum_ < (uint)name.field_2._12_4_;
          type.enum_ = type.enum_ + ~I64) {
        local_78 = FuncDeclaration::GetParamType(this_01,type.enum_);
        local_70 = local_78;
        Write(this,local_78);
        local_80 = local_70;
        cVar3 = MangleType(local_70);
        Writef(this," %c%d;",(ulong)(uint)(int)cVar3,(ulong)(uint)type.enum_);
        Write(this);
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,char_const(&)[2],wabt::(anonymous_namespace)::Newline,char_const(&)[12],std::__cxx11::string_const&,char_const(&)[4],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,local_82,(char (*) [2])0x21ded1,&local_83,
                 (char (*) [12])"#endif  /* ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                 (char (*) [4])0x21d91c,&local_84);
      std::__cxx11::string::~string((string *)&i);
    }
    __gnu_cxx::
    __normal_iterator<wabt::Tag_*const_*,_std::vector<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>_>::
    operator++(&__end2);
  }
  return;
}

Assistant:

void CWriter::WriteTagTypes() {
  for (const Tag* tag : module_->tags) {
    const FuncDeclaration& tag_type = tag->decl;
    Index num_params = tag_type.GetNumParams();
    if (num_params <= 1) {
      continue;
    }
    const std::string name = MangleTagTypes(tag_type.sig.param_types);
    // use same method as WriteMultivalueTypes
    Write("#ifndef ", name, Newline());
    Write("#define ", name, " ", name, Newline());
    Write("struct ", name, " ", OpenBrace());
    for (Index i = 0; i < num_params; ++i) {
      Type type = tag_type.GetParamType(i);
      Write(type);
      Writef(" %c%d;", MangleType(type), i);
      Write(Newline());
    }
    Write(CloseBrace(), ";", Newline(), "#endif  /* ", name, " */", Newline());
  }
}